

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_srl_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pfVar1 = (env->active_fpu).fpr + ws;
  uVar3 = pfVar1->fs[1];
  uVar4 = pfVar1->fs[2];
  uVar5 = pfVar1->fs[3];
  auVar6 = (undefined1  [16])(env->active_fpu).fpr[wt] & _DAT_00d835d0;
  auVar7 = pshuflw(in_XMM2,auVar6,0xfe);
  auVar8 = pshuflw(auVar7,auVar6,0x54);
  auVar6._0_8_ = auVar6._8_8_;
  auVar9 = pshuflw(auVar8,auVar6,0xfe);
  auVar6 = pshuflw(auVar6,auVar6,0x54);
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fs[0] = pfVar1->fs[0] >> auVar8._0_8_;
  pfVar2->fs[1] = uVar3 >> auVar7._0_8_;
  pfVar2->fs[2] = uVar4 >> auVar6._0_8_;
  pfVar2->fs[3] = uVar5 >> auVar9._0_8_;
  return;
}

Assistant:

void helper_msa_srl_w(CPUMIPSState *env,
                      uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_srl_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_srl_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_srl_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_srl_df(DF_WORD, pws->w[3],  pwt->w[3]);
}